

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O3

void __thiscall
dlib::con_<512l,1l,1l,1,1,0,0>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<128l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,true,void>>
          (con_<512l,1l,1l,1,1,0,0> *this,
          subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  tensor_conv *this_00;
  con_<512l,1l,1l,1,1,0,0> *this_01;
  _Head_base<0UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
  _Var1;
  tensor *data;
  alias_tensor_instance local_c0;
  alias_tensor_instance local_78;
  
  this_00 = (tensor_conv *)(this + 0x128);
  this_01 = this + 0x98;
  _Var1._M_head_impl =
       (sub->l->subnetwork)._M_t.
       super___uniq_ptr_impl<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
       .
       super__Head_base<0UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
       ._M_head_impl;
  alias_tensor::operator()(&local_c0,(alias_tensor *)this_01,(tensor *)this,0);
  cpu::tensor_conv::setup
            (this_00,&((_Var1._M_head_impl)->cached_output).super_tensor,&local_c0.super_tensor,1,1,
             *(int *)(this + 0x170),*(int *)(this + 0x174));
  data = &(((sub->l->subnetwork)._M_t.
            super___uniq_ptr_impl<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
            .
            super__Head_base<0UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
           ._M_head_impl)->cached_output).super_tensor;
  if (this[0x178] == (con_<512l,1l,1l,1,1,0,0>)0x1) {
    alias_tensor::operator()(&local_c0,(alias_tensor *)this_01,(tensor *)this,0);
    alias_tensor::operator()
              (&local_78,(alias_tensor *)(this + 0xe0),(tensor *)this,*(size_t *)(this + 0xc0));
    cpu::tensor_conv::operator()
              (this_00,false,output,data,&local_c0.super_tensor,&local_78.super_tensor,
               (bool)this[0x179]);
  }
  else {
    alias_tensor::operator()(&local_c0,(alias_tensor *)this_01,(tensor *)this,0);
    cpu::tensor_conv::operator()(this_00,false,output,data,&local_c0.super_tensor);
  }
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            conv.setup(sub.get_output(),
                       filters(params,0),
                       _stride_y,
                       _stride_x,
                       padding_y_,
                       padding_x_);

            if (use_bias)
            {
                conv(false, output,
                     sub.get_output(),
                     filters(params,0),
                     biases(params, filters.size()),
                     use_relu);
            }
            else
            {
                conv(false, output,
                     sub.get_output(),
                     filters(params,0));
            }
        }